

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cxx17_string_view.cpp
# Opt level: O0

void __thiscall
iu_StringViewSplit_x_iutest_x_chain_at_last_front_by_c_str_Test<char16_t>::Body
          (iu_StringViewSplit_x_iutest_x_chain_at_last_front_by_c_str_Test<char16_t> *this)

{
  bool bVar1;
  char16_t *pcVar2;
  char *message;
  basic_string_view<char16_t,_std::char_traits<char16_t>_> *in_R9;
  AssertionHelper local_240;
  Fixed local_200;
  char16_t *local_78;
  undefined1 local_70 [8];
  AssertionResult iutest_ar;
  split_helper<const_char16_t_*,_false,_true,_false> local_40;
  split_helper_subroutine<detail::split_at_last_front,_const_char16_t_*,_char16_t> local_38;
  undefined1 local_30 [8];
  basic_string_view<char16_t,_std::char_traits<char16_t>_> re;
  basic_string_view<char16_t,_std::char_traits<char16_t>_> s;
  iu_StringViewSplit_x_iutest_x_chain_at_last_front_by_c_str_Test<char16_t> *this_local;
  
  pcVar2 = constant::arikitari_na_world_underscore<char16_t>();
  std::basic_string_view<char16_t,_std::char_traits<char16_t>_>::basic_string_view
            ((basic_string_view<char16_t,_std::char_traits<char16_t>_> *)&re._M_str,pcVar2);
  pcVar2 = constant::space_underscore<char16_t>();
  local_40 = split<const_char16_t_*,_nullptr>(pcVar2);
  at_last();
  detail::split_at_last::front((split_at_last *)&iutest_ar.field_0x26);
  local_38 = detail::split_helper<const_char16_t_*,_false,_true,_false>::
             operator>><detail::split_at_last_front,_nullptr>(&local_40);
  _local_30 = detail::
              operator|<std::basic_string_view<char16_t,_std::char_traits<char16_t>_>,_const_char16_t_*,_char16_t,_nullptr>
                        ((basic_string_view<char16_t,_std::char_traits<char16_t>_> *)&re._M_str,
                         &local_38);
  iutest::detail::AlwaysZero();
  local_78 = constant::arikitari_na<char16_t>();
  iutest::internal::EqHelper<false>::
  Compare<char16_t_const*,std::basic_string_view<char16_t,std::char_traits<char16_t>>>
            ((AssertionResult *)local_70,(EqHelper<false> *)"constant::arikitari_na<char_type>()",
             "re",(char *)&local_78,(char16_t **)local_30,in_R9);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_70);
  if (!bVar1) {
    memset(&local_200,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_200);
    message = iutest::AssertionResult::message((AssertionResult *)local_70);
    iutest::AssertionHelper::AssertionHelper
              (&local_240,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/yumetodo[P]string_split/test/test_cxx17_string_view.cpp"
               ,0x9c,message,kFatalFailure);
    iutest::AssertionHelper::operator=(&local_240,&local_200);
    iutest::AssertionHelper::~AssertionHelper(&local_240);
    iutest::AssertionHelper::Fixed::~Fixed(&local_200);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_70);
  return;
}

Assistant:

IUTEST_TYPED_TEST(StringViewSplit, chain_at_last_front_by_c_str)
{
	using char_type = TypeParam;
	const std::basic_string_view<char_type> s = constant::arikitari_na_world_underscore<char_type>();
	const auto re = s | split(constant::space_underscore<char_type>()) >> at_last().front();
	IUTEST_ASSERT_EQ(constant::arikitari_na<char_type>(), re);
}